

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

string * __thiscall
soul::ExpressionHelpers::resolvePartialNameAsUID_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionHelpers *this,ModuleBase *module,
          IdentifierPath *partialName)

{
  bool bVar1;
  size_t sVar2;
  pool_ref<soul::AST::ASTObject> *ppVar3;
  ModuleBase *this_00;
  TypeDeclarationBase *this_01;
  VariableDeclaration *this_02;
  EndpointDeclaration *this_03;
  Function *this_04;
  ModuleBase *m;
  TypeDeclarationBase *t_00;
  VariableDeclaration *v_00;
  EndpointDeclaration *e_00;
  Function *f_00;
  pool_ref<soul::AST::ASTObject> local_150;
  pool_ptr<soul::AST::Function> local_148;
  pool_ptr<soul::AST::Function> f;
  pool_ptr<soul::AST::EndpointDeclaration> local_138;
  pool_ptr<soul::AST::EndpointDeclaration> e;
  pool_ptr<soul::AST::VariableDeclaration> local_128;
  pool_ptr<soul::AST::VariableDeclaration> v;
  pool_ptr<soul::AST::TypeDeclarationBase> local_118;
  pool_ptr<soul::AST::TypeDeclarationBase> t;
  pool_ref<soul::AST::ASTObject> local_108;
  pool_ptr<soul::AST::ModuleBase> local_100;
  pool_ptr<soul::AST::ModuleBase> mb;
  pool_ref<soul::AST::ASTObject> item;
  undefined1 local_e0 [8];
  NameSearch search;
  IdentifierPath *partialName_local;
  ModuleBase *module_local;
  
  search._184_8_ = module;
  AST::Scope::NameSearch::NameSearch((NameSearch *)local_e0);
  IdentifierPath::operator=
            ((IdentifierPath *)(search.itemsFound.space + 7),(IdentifierPath *)search._184_8_);
  search.partiallyQualifiedPath.pathSections.space[7]._0_1_ = 1;
  search.stopAtFirstScopeWithResults = true;
  search._177_1_ = 1;
  search._178_1_ = 1;
  search._179_1_ = 1;
  search.requiredNumFunctionArgs._0_1_ = 1;
  search.requiredNumFunctionArgs._1_1_ = 0;
  search.requiredNumFunctionArgs._2_1_ = 1;
  AST::Scope::performFullNameSearch((Scope *)(this + 0x28),(NameSearch *)local_e0,(Statement *)0x0);
  sVar2 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::size
                    ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)local_e0);
  if (sVar2 != 0) {
    ppVar3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                       ((ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL> *)
                        local_e0);
    local_108.object = ppVar3->object;
    mb.object = (ModuleBase *)local_108.object;
    cast<soul::AST::ModuleBase,soul::AST::ASTObject>((soul *)&local_100,&local_108);
    pool_ref<soul::AST::ASTObject>::~pool_ref(&local_108);
    t.object._4_1_ = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_100);
    if (t.object._4_1_) {
      this_00 = pool_ptr<soul::AST::ModuleBase>::operator*(&local_100);
      makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_00,m);
    }
    t.object._5_3_ = 0;
    pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_100);
    if (t.object._4_4_ == 0) {
      v.object = (VariableDeclaration *)mb.object;
      cast<soul::AST::TypeDeclarationBase,soul::AST::ASTObject>
                ((soul *)&local_118,(pool_ref<soul::AST::ASTObject> *)&v);
      pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&v);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_118);
      if (bVar1) {
        this_01 = pool_ptr<soul::AST::TypeDeclarationBase>::operator*(&local_118);
        makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_01,t_00);
      }
      t.object._5_3_ = 0;
      t.object._4_1_ = bVar1;
      pool_ptr<soul::AST::TypeDeclarationBase>::~pool_ptr(&local_118);
      if (t.object._4_4_ == 0) {
        e.object = (EndpointDeclaration *)mb.object;
        cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>
                  ((soul *)&local_128,(pool_ref<soul::AST::ASTObject> *)&e);
        pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&e);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_128);
        if (bVar1) {
          this_02 = pool_ptr<soul::AST::VariableDeclaration>::operator*(&local_128);
          makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_02,v_00);
        }
        t.object._5_3_ = 0;
        t.object._4_1_ = bVar1;
        pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(&local_128);
        if (t.object._4_4_ == 0) {
          f.object = (Function *)mb.object;
          cast<soul::AST::EndpointDeclaration,soul::AST::ASTObject>
                    ((soul *)&local_138,(pool_ref<soul::AST::ASTObject> *)&f);
          pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&f);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_138);
          if (bVar1) {
            this_03 = pool_ptr<soul::AST::EndpointDeclaration>::operator*(&local_138);
            makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_03,e_00);
          }
          t.object._5_3_ = 0;
          t.object._4_1_ = bVar1;
          pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_138);
          if (t.object._4_4_ == 0) {
            local_150.object = &(mb.object)->super_ASTObject;
            cast<soul::AST::Function,soul::AST::ASTObject>((soul *)&local_148,&local_150);
            pool_ref<soul::AST::ASTObject>::~pool_ref(&local_150);
            bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_148);
            if (bVar1) {
              this_04 = pool_ptr<soul::AST::Function>::operator*(&local_148);
              makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)this_04,f_00);
            }
            t.object._5_3_ = 0;
            t.object._4_1_ = bVar1;
            pool_ptr<soul::AST::Function>::~pool_ptr(&local_148);
            if (t.object._4_4_ == 0) {
              t.object._4_4_ = 0;
            }
          }
        }
      }
    }
    pool_ref<soul::AST::ASTObject>::~pool_ref((pool_ref<soul::AST::ASTObject> *)&mb);
    if (t.object._4_4_ != 0) goto LAB_004fa6fc;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  t.object._4_4_ = 1;
LAB_004fa6fc:
  AST::Scope::NameSearch::~NameSearch((NameSearch *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

static std::string resolvePartialNameAsUID (AST::ModuleBase& module, const IdentifierPath& partialName)
    {
        AST::Scope::NameSearch search;
        search.partiallyQualifiedPath = partialName;
        search.stopAtFirstScopeWithResults = true;
        search.findVariables = true;
        search.findTypes = true;
        search.findFunctions = true;
        search.findNamespaces = true;
        search.findProcessors = true;
        search.findProcessorInstances = false;
        search.findEndpoints = true;

        module.performFullNameSearch (search, nullptr);

        if (search.itemsFound.size() != 0)
        {
            auto item = search.itemsFound.front();

            if (auto mb = cast<AST::ModuleBase> (item))            return makeUID (*mb);
            if (auto t = cast<AST::TypeDeclarationBase> (item))    return makeUID (*t);
            if (auto v = cast<AST::VariableDeclaration> (item))    return makeUID (*v);
            if (auto e = cast<AST::EndpointDeclaration> (item))    return makeUID (*e);
            if (auto f = cast<AST::Function> (item))               return makeUID (*f);
        }

        return {};
    }